

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgFirstPermutation(Abc_TgMan_t *pMan)

{
  int iVar1;
  TiedGroup *pTVar2;
  char *pDirs;
  char *pVars;
  int nGvars;
  TiedGroup *pGrp;
  int i;
  Abc_TgMan_t *pMan_local;
  
  for (pGrp._4_4_ = 0; pGrp._4_4_ < pMan->nGVars; pGrp._4_4_ = pGrp._4_4_ + 1) {
    pMan->pPermDir[pGrp._4_4_] = -1;
  }
  pGrp._4_4_ = 0;
  while( true ) {
    if (pMan->nGroups <= pGrp._4_4_) {
      return;
    }
    pTVar2 = pMan->pGroup + pGrp._4_4_;
    iVar1 = Abc_TgIsInitPerm(pMan->pPerm + (int)pTVar2->iStart,pMan->pPermDir + (int)pTVar2->iStart,
                             (int)pTVar2->nGVars);
    if (iVar1 == 0) break;
    pGrp._4_4_ = pGrp._4_4_ + 1;
  }
  __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x89f,"void Abc_TgFirstPermutation(Abc_TgMan_t *)");
}

Assistant:

static void Abc_TgFirstPermutation(Abc_TgMan_t * pMan)
{
    int i;
    for (i = 0; i < pMan->nGVars; i++)
        pMan->pPermDir[i] = -1;
#ifndef NDEBUG
    for (i = 0; i < pMan->nGroups; i++)
    {
        TiedGroup * pGrp = pMan->pGroup + i;
        int nGvars = pGrp->nGVars;
        char * pVars = pMan->pPerm + pGrp->iStart;
        signed char * pDirs = pMan->pPermDir + pGrp->iStart;
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
#endif
}